

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTest.cpp
# Opt level: O2

bool __thiscall BaseTest::testEqual(BaseTest *this)

{
  pointer pRVar1;
  long lVar2;
  long lVar3;
  rep *prVar4;
  
  pRVar1 = (this->results).super__Vector_base<BaseTest::Result,_std::allocator<BaseTest::Result>_>.
           _M_impl.super__Vector_impl_data._M_start;
  prVar4 = &pRVar1[1].time;
  lVar3 = 0;
  do {
    lVar3 = lVar3 + 1;
    if (this->N <= lVar3) break;
    lVar2 = *prVar4;
    prVar4 = prVar4 + 4;
  } while (ABS((double)lVar2 - (double)pRVar1->time) < 0.001);
  return this->N <= lVar3;
}

Assistant:

bool BaseTest::testEqual()
{
	auto deq = [](double a, double b)
	{ return std::abs(a - b) < 1e-3; };
	for (int i = 1; i < N; ++i)
		if (!deq(results[i].time, results[0].time))
			return false;
	return true;
}